

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VRDatumFactory.cpp
# Opt level: O3

VRDatumPtr __thiscall
MinVR::VRDatumFactory::CreateVRDatum(VRDatumFactory *this,int VRDatumId,void *pData)

{
  long lVar1;
  VRError *this_00;
  int iVar2;
  VRDatumPtrRC *extraout_RDX;
  undefined4 in_register_00000034;
  long lVar3;
  long lVar4;
  VRDatumPtr VVar5;
  int local_b4;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  lVar4 = *(long *)(CONCAT44(in_register_00000034,VRDatumId) + 0x10);
  if (lVar4 != 0) {
    lVar3 = CONCAT44(in_register_00000034,VRDatumId) + 8;
    lVar1 = lVar3;
    do {
      iVar2 = (int)pData;
      if (iVar2 <= *(int *)(lVar4 + 0x20)) {
        lVar1 = lVar4;
      }
      lVar4 = *(long *)(lVar4 + 0x10 + (ulong)(*(int *)(lVar4 + 0x20) < iVar2) * 8);
    } while (lVar4 != 0);
    if ((lVar1 != lVar3) && (*(int *)(lVar1 + 0x20) <= iVar2)) {
      (**(code **)(lVar1 + 0x28))(this);
      VVar5.reference = extraout_RDX;
      VVar5.pData = (VRDatum_conflict *)this;
      return VVar5;
    }
  }
  this_00 = (VRError *)__cxa_allocate_exception(0xa8);
  local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"Unknown VR type ID.","");
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"");
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_70,
             "/workspace/llm4binary/github/license_c_cmakelists/MinVR[P]MinVR/src/config/VRDatumFactory.cpp"
             ,"");
  local_b4 = 0xb;
  local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_90,"VRDatumPtr MinVR::VRDatumFactory::CreateVRDatum(int, void *)","");
  VRError::VRError(this_00,&local_b0,&local_50,&local_70,&local_b4,&local_90);
  __cxa_throw(this_00,&VRError::typeinfo,VRError::~VRError);
}

Assistant:

VRDatumPtr VRDatumFactory::CreateVRDatum(int VRDatumId,
                                         void* pData) {
  // try to find the callback corresponding to the given type id;
  // if no id found, throw exception
  CallbackMap::const_iterator it = m_callbacks.find(VRDatumId);
  if (it == m_callbacks.end()) {
    VRERRORNOADV("Unknown VR type ID.");
  } else {
    // create the instance using the creator callback
    return VRDatumPtr((it->second)(static_cast<void *>(pData)));
  }
}